

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O3

HighsInt highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                   (int *key,HighsInt root,anon_class_8_1_8991fb9c *get_left,
                   anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int iVar1;
  HPresolve *pHVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  HPresolve *pHVar8;
  HighsInt y;
  long lVar9;
  HPresolve *pHVar10;
  int local_20;
  int local_1c;
  HighsInt Nright;
  HighsInt Nleft;
  
  if (root == -1) {
    return -1;
  }
  piVar6 = &local_1c;
  local_1c = -1;
  piVar7 = &local_20;
  local_20 = -1;
  pHVar2 = get_key[0xb].this;
  do {
    iVar1 = *key;
    lVar5 = (long)root;
    iVar4 = *(int *)((long)&pHVar2->model + lVar5 * 4);
    if (iVar1 < iVar4) {
      pHVar10 = get_left[0x1a].this;
      iVar4 = *(int *)((long)&pHVar10->model + lVar5 * 4);
      lVar9 = (long)iVar4;
      if (lVar9 == -1) {
        pHVar8 = get_right[0x1d].this;
        iVar4 = -1;
        goto LAB_0031aab1;
      }
      if (iVar1 < *(int *)((long)&pHVar2->model + lVar9 * 4)) {
        pHVar8 = get_right[0x1d].this;
        *(undefined4 *)((long)&pHVar10->model + lVar5 * 4) =
             *(undefined4 *)((long)&pHVar8->model + lVar9 * 4);
        *(HighsInt *)((long)&pHVar8->model + lVar9 * 4) = root;
        lVar5 = lVar9;
        root = iVar4;
        if (*(int *)((long)&pHVar10->model + lVar9 * 4) == -1) goto LAB_0031aa93;
      }
      *piVar6 = root;
      piVar3 = (int *)((long)&pHVar10->model + lVar5 * 4);
      piVar6 = piVar3;
    }
    else {
      pHVar8 = get_right[0x1d].this;
      if (iVar1 <= iVar4) {
LAB_0031aa93:
        pHVar10 = get_left[0x1a].this;
        iVar4 = *(int *)((long)&pHVar10->model + lVar5 * 4);
LAB_0031aab1:
        *piVar7 = iVar4;
        *piVar6 = *(int *)((long)&pHVar8->model + lVar5 * 4);
        *(int *)((long)&pHVar10->model + lVar5 * 4) = local_20;
        *(int *)((long)&pHVar8->model + lVar5 * 4) = local_1c;
        return root;
      }
      iVar4 = *(int *)((long)&pHVar8->model + lVar5 * 4);
      lVar9 = (long)iVar4;
      if (lVar9 == -1) goto LAB_0031aa93;
      if (*(int *)((long)&pHVar2->model + lVar9 * 4) < iVar1) {
        pHVar10 = get_left[0x1a].this;
        *(undefined4 *)((long)&pHVar8->model + lVar5 * 4) =
             *(undefined4 *)((long)&pHVar10->model + lVar9 * 4);
        *(HighsInt *)((long)&pHVar10->model + lVar9 * 4) = root;
        lVar5 = lVar9;
        root = iVar4;
        if (*(int *)((long)&pHVar8->model + lVar9 * 4) == -1) goto LAB_0031aa93;
      }
      *piVar7 = root;
      piVar3 = (int *)((long)&pHVar8->model + lVar5 * 4);
      piVar7 = piVar3;
    }
    root = *piVar3;
  } while( true );
}

Assistant:

HighsInt highs_splay(const KeyT& key, HighsInt root, GetLeft&& get_left,
                     GetRight&& get_right, GetKey&& get_key) {
  if (root == -1) return -1;

  HighsInt Nleft = -1;
  HighsInt Nright = -1;
  HighsInt* lright = &Nright;
  HighsInt* rleft = &Nleft;

  while (true) {
    if (key < get_key(root)) {
      HighsInt left = get_left(root);
      if (left == -1) break;
      if (key < get_key(left)) {
        HighsInt y = left;
        get_left(root) = get_right(y);
        get_right(y) = root;
        root = y;
        if (get_left(root) == -1) break;
      }

      *rleft = root;
      rleft = &get_left(root);
      root = get_left(root);
    } else if (key > get_key(root)) {
      HighsInt right = get_right(root);
      if (right == -1) break;
      if (key > get_key(right)) {
        HighsInt y = right;
        get_right(root) = get_left(y);
        get_left(y) = root;
        root = y;
        if (get_right(root) == -1) break;
      }

      *lright = root;
      lright = &get_right(root);
      root = get_right(root);
    } else
      break;
  }

  *lright = get_left(root);
  *rleft = get_right(root);
  get_left(root) = Nright;
  get_right(root) = Nleft;

  return root;
}